

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *label;
  float row_min_height;
  ImVec2 IVar7;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 local_58 [16];
  
  table = GImGui->CurrentTable;
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  IVar7 = GetCursorScreenPos();
  local_58._8_8_ = extraout_XMM0_Qb;
  local_58._0_4_ = IVar7.x;
  local_58._4_4_ = IVar7.y;
  row_min_height = TableGetHeaderRowHeight();
  TableNextRow(1,row_min_height);
  if (table->HostSkipItems == false) {
    auVar1 = vmovshdup_avx(local_58);
    uVar6 = 0;
    uVar5 = 0;
    if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
      uVar6 = GImGui->CurrentTable->ColumnsCount;
    }
    for (; (~((int)uVar6 >> 0x1f) & uVar6) != uVar5; uVar5 = uVar5 + 1) {
      bVar3 = TableSetColumnIndex(uVar5);
      if (bVar3) {
        uVar4 = TableGetColumnFlags(uVar5);
        label = "";
        if ((uVar4 >> 0xc & 1) == 0) {
          label = TableGetColumnName(uVar5);
        }
        PushID((int)table->InstanceCurrent * table->ColumnsCount + uVar5);
        TableHeader(label);
        PopID();
      }
    }
    IVar7 = GetMousePos();
    bVar3 = IsMouseReleased(1);
    if (bVar3) {
      if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = (uint)GImGui->CurrentTable->HoveredColumnBody;
      }
      if (uVar5 == uVar6) {
        auVar2._8_8_ = extraout_XMM0_Qb_00;
        auVar2._0_4_ = IVar7.x;
        auVar2._4_4_ = IVar7.y;
        auVar2 = vmovshdup_avx(auVar2);
        local_58._0_4_ = auVar1._0_4_;
        if (((float)local_58._0_4_ <= auVar2._0_4_) &&
           (auVar2._0_4_ < (float)local_58._0_4_ + row_min_height)) {
          TableOpenContextMenu(-1);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}